

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_aout.c
# Opt level: O2

void aoutstd_writeexec(GlobalVars *gv,FILE *f)

{
  uint32_t mid;
  bool bVar1;
  uint32_t tsize;
  uint32_t dsize;
  uint32_t bsize;
  uint32_t syms;
  lword lVar2;
  char cVar3;
  int be;
  LinkedSection *sections [3];
  
  cVar3 = fff[gv->dest_format]->endianess;
  if (cVar3 < '\0') {
    cVar3 = gv->endianess;
  }
  mid = fff[gv->dest_format]->id;
  aout_initwrite(gv,sections);
  if (sections[0] == (LinkedSection *)0x0) {
    error(0x61,fff[gv->dest_format]->tname,".text");
  }
  be = (int)cVar3;
  aout_addsymlist(gv,sections,'\x01','\0',be);
  aout_addsymlist(gv,sections,'\x02','\0',be);
  aout_addsymlist(gv,sections,'\0','\0',be);
  aout_debugsyms(gv,be);
  calc_relocs(gv,sections[0]);
  calc_relocs(gv,sections[1]);
  bVar1 = isPIC(sections);
  tsize = aout_getpagedsize(gv,sections,0);
  dsize = aout_getpagedsize(gv,sections,1);
  bsize = aout_getpagedsize(gv,sections,2);
  syms = aoutsymlist.nextindex * 0xc;
  lVar2 = entry_address(gv);
  aout_header(f,0x10b,mid,(uint)(bVar1 != 0) << 4,tsize,dsize,bsize,syms,(uint32_t)lVar2,0,0,be);
  aout_pagedsection(gv,f,sections,0);
  aout_pagedsection(gv,f,sections,1);
  aout_writesymbols(f);
  aout_writestrings(f,be);
  return;
}

Assistant:

void aoutstd_writeexec(struct GlobalVars *gv,FILE *f)
/* creates a standard a.out paged executable file */
{
  uint32_t mid = fff[gv->dest_format]->id;
  int be = (int)fff[gv->dest_format]->endianess;
  struct LinkedSection *sections[3];

  if (be < 0)
    be = gv->endianess;
  aout_initwrite(gv,sections);
  if (sections[0] == NULL)  /* this requires a .text section! */
    error(97,fff[gv->dest_format]->tname,TEXTNAME);
  aout_addsymlist(gv,sections,BIND_GLOBAL,0,be);
  aout_addsymlist(gv,sections,BIND_WEAK,0,be);
  aout_addsymlist(gv,sections,BIND_LOCAL,0,be);
  aout_debugsyms(gv,be);
  calc_relocs(gv,sections[0]);
  calc_relocs(gv,sections[1]);

  aout_header(f,ZMAGIC,mid,isPIC(sections) ? EX_PIC : 0, /* @@@ DYNAMIC? */
              aout_getpagedsize(gv,sections,0),
              aout_getpagedsize(gv,sections,1),
              aout_getpagedsize(gv,sections,2),
              aoutsymlist.nextindex * sizeof(struct nlist32),
              (uint32_t)entry_address(gv),0,0,be);
  aout_pagedsection(gv,f,sections,0);
  aout_pagedsection(gv,f,sections,1);
  aout_writesymbols(f);
  aout_writestrings(f,be);
}